

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_rsassa_pkcs1_v15_verify
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  size_t sVar1;
  uchar *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  mbedtls_md_info_t *md_info;
  uchar *puVar6;
  size_t __n;
  ulong __n_00;
  long lVar7;
  bool bVar8;
  uchar *local_468;
  size_t asn1_len;
  mbedtls_md_type_t msg_md_alg;
  mbedtls_asn1_buf oid;
  uchar buf [1024];
  
  if ((mode != 1) || (iVar4 = -0x4080, ctx->padding == 0)) {
    sVar1 = ctx->len;
    iVar4 = -0x4080;
    if (0xfffffffffffffc0e < sVar1 - 0x401) {
      if (mode == 0) {
        iVar4 = mbedtls_rsa_public(ctx,sig,buf);
      }
      else {
        iVar4 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,buf);
      }
      if (((iVar4 == 0) && (iVar4 = -0x4100, buf[0] == '\0')) && (buf[1] == '\x01')) {
        for (lVar7 = 0; buf[lVar7 + 2] != '\0'; lVar7 = lVar7 + 1) {
          if (buf + (sVar1 - 1) <= buf + lVar7 + 2) {
            return -0x4100;
          }
          if (buf[lVar7 + 2] != 0xff) {
            return -0x4100;
          }
        }
        puVar6 = buf + lVar7 + 3;
        __n = (sVar1 - lVar7) - 3;
        local_468 = puVar6;
        if (md_alg == MBEDTLS_MD_NONE && (sVar1 - hashlen) + -3 == lVar7) {
          iVar5 = bcmp(puVar6,hash,__n);
          bVar8 = iVar5 == 0;
        }
        else {
          md_info = mbedtls_md_info_from_type(md_alg);
          if (md_info == (mbedtls_md_info_t *)0x0) {
            return -0x4080;
          }
          bVar3 = mbedtls_md_get_size(md_info);
          puVar6 = puVar6 + __n;
          iVar4 = mbedtls_asn1_get_tag(&local_468,puVar6,&asn1_len,0x30);
          if (iVar4 != 0) {
            return -0x4380;
          }
          if ((sVar1 - asn1_len) + -5 != lVar7) {
            return -0x4380;
          }
          iVar4 = mbedtls_asn1_get_tag(&local_468,puVar6,&asn1_len,0x30);
          if (iVar4 != 0) {
            return -0x4380;
          }
          __n_00 = (ulong)bVar3;
          if ((sVar1 - (asn1_len + __n_00)) + -9 != lVar7) {
            return -0x4380;
          }
          iVar4 = mbedtls_asn1_get_tag(&local_468,puVar6,&oid.len,6);
          if (iVar4 != 0) {
            return -0x4380;
          }
          oid.p = local_468;
          local_468 = local_468 + oid.len;
          iVar4 = mbedtls_oid_get_md_alg(&oid,&msg_md_alg);
          if (iVar4 != 0) {
            return -0x4380;
          }
          if (msg_md_alg != md_alg) {
            return -0x4380;
          }
          iVar4 = mbedtls_asn1_get_tag(&local_468,puVar6,&asn1_len,5);
          if (iVar4 != 0) {
            return -0x4380;
          }
          iVar4 = mbedtls_asn1_get_tag(&local_468,puVar6,&asn1_len,4);
          puVar2 = local_468;
          if (iVar4 != 0) {
            return -0x4380;
          }
          if (asn1_len != __n_00) {
            return -0x4380;
          }
          iVar4 = bcmp(local_468,hash,__n_00);
          if (iVar4 != 0) {
            return -0x4380;
          }
          iVar5 = 0;
          bVar8 = puVar2 + __n_00 == puVar6;
        }
        iVar4 = -0x4380;
        if (bVar8) {
          iVar4 = iVar5;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_verify( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode,
                                 mbedtls_md_type_t md_alg,
                                 unsigned int hashlen,
                                 const unsigned char *hash,
                                 const unsigned char *sig )
{
    int ret;
    size_t len, siglen, asn1_len;
    unsigned char *p, *end;
    mbedtls_md_type_t msg_md_alg;
    const mbedtls_md_info_t *md_info;
    mbedtls_asn1_buf oid;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( *p++ != 0 || *p++ != MBEDTLS_RSA_SIGN )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    while( *p != 0 )
    {
        if( p >= buf + siglen - 1 || *p != 0xFF )
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
        p++;
    }
    p++;

    len = siglen - ( p - buf );

    if( len == hashlen && md_alg == MBEDTLS_MD_NONE )
    {
        if( memcmp( p, hash, hashlen ) == 0 )
            return( 0 );
        else
            return( MBEDTLS_ERR_RSA_VERIFY_FAILED );
    }

    md_info = mbedtls_md_info_from_type( md_alg );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    hashlen = mbedtls_md_get_size( md_info );

    end = p + len;

    /*
     * Parse the ASN.1 structure inside the PKCS#1 v1.5 structure
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len + 2 != len )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len + 6 + hashlen != len )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &oid.len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    oid.p = p;
    p += oid.len;

    if( mbedtls_oid_get_md_alg( &oid, &msg_md_alg ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( md_alg != msg_md_alg )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    /*
     * assume the algorithm parameters must be NULL
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len, MBEDTLS_ASN1_NULL ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len != hashlen )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( memcmp( p, hash, hashlen ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    p += hashlen;

    if( p != end )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    return( 0 );
}